

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-util.c++
# Opt level: O1

Promise<void> __thiscall
capnp::_::TestMoreStuffImpl::throwExceptionWithDetail
          (TestMoreStuffImpl *this,ThrowExceptionWithDetailContext context)

{
  uchar *puVar1;
  size_t sVar2;
  char *pcVar3;
  undefined8 uVar4;
  char (*in_RCX) [15];
  Array<unsigned_char> result;
  Exception e;
  Array<unsigned_char> local_1e8;
  String local_1c8;
  undefined8 local_1b0;
  Exception local_1a8;
  
  kj::_::Debug::makeDescription<char_const(&)[15]>
            (&local_1c8,(Debug *)"\"test exception\"","test exception",in_RCX);
  kj::Exception::Exception
            (&local_1a8,FAILED,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
             ,0x4c4,&local_1c8);
  sVar2 = local_1c8.content.size_;
  pcVar3 = local_1c8.content.ptr;
  if (local_1c8.content.ptr != (char *)0x0) {
    local_1c8.content.ptr = (char *)0x0;
    local_1c8.content.size_ = 0;
    (*(code *)**(undefined8 **)local_1c8.content.disposer)
              (local_1c8.content.disposer,pcVar3,1,sVar2,sVar2,0);
  }
  local_1e8.ptr =
       (uchar *)kj::_::HeapArrayDisposer::allocateImpl
                          (1,0,3,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
  local_1e8.ptr[2] = 'o';
  local_1e8.ptr[0] = 'f';
  local_1e8.ptr[1] = 'o';
  local_1e8.size_ = 3;
  local_1e8.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  kj::Exception::setDetail(&local_1a8,1,&local_1e8);
  sVar2 = local_1e8.size_;
  puVar1 = local_1e8.ptr;
  if (local_1e8.ptr != (uchar *)0x0) {
    local_1e8.ptr = (uchar *)0x0;
    local_1e8.size_ = 0;
    (*(code *)**(undefined8 **)local_1e8.disposer)(local_1e8.disposer,puVar1,1,sVar2,sVar2,0);
  }
  kj::_::PromiseDisposer::
  alloc<kj::_::ImmediateBrokenPromiseNode,kj::_::PromiseDisposer,kj::Exception>
            ((PromiseDisposer *)&local_1b0,&local_1a8);
  uVar4 = local_1b0;
  local_1b0 = 0;
  *(undefined8 *)&this->super_Server = uVar4;
  kj::Exception::~Exception(&local_1a8);
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<void> TestMoreStuffImpl::throwExceptionWithDetail(
    ThrowExceptionWithDetailContext context) {
  auto e = KJ_EXCEPTION(FAILED, "test exception");
  e.setDetail(1, kj::heapArray<byte>("foo"_kjb));
  return e;
}